

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O3

void __thiscall ByteString::ByteString(ByteString *this,char *hexString)

{
  ulong uVar1;
  ulong uVar2;
  string byteStr;
  string hex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->_vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&PTR__SecureAllocator_00151c08;
  std::__cxx11::string::string((string *)&local_40,hexString,(allocator *)&local_60);
  if ((local_40._M_string_length & 1) != 0) {
    std::operator+(&local_60,"0",&local_40);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  if (local_40._M_string_length != 0) {
    uVar2 = 0;
    do {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::push_back((char)&local_60);
      std::__cxx11::string::push_back((char)&local_60);
      uVar1 = strtoul(local_60._M_dataplus._M_p,(char **)0x0,0x10);
      operator+=(this,(uchar)uVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 2;
    } while (uVar2 < local_40._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

ByteString::ByteString(const char* hexString)
{
	std::string hex = std::string(hexString);

	if (hex.size() % 2 != 0)
	{
		hex = "0" + hex;
	}

	for (size_t i = 0; i < hex.size(); i += 2)
	{
		std::string byteStr;
		byteStr += hex[i];
		byteStr += hex[i+1];

		unsigned char byteVal = (unsigned char) strtoul(byteStr.c_str(), NULL, 16);

		this->operator+=(byteVal);
	}
}